

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.c
# Opt level: O2

void games_load(void)

{
  acesup_load();
  easthaven_load();
  freecell_load();
  klondike_load();
  pyramid_load();
  tripeaks_load();
  return;
}

Assistant:

void games_load(void)
{
	acesup_load();
	easthaven_load();
	freecell_load();
	klondike_load();
	pyramid_load();
	tripeaks_load();
}